

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O1

BBox * __thiscall CMU462::StaticScene::Sphere::get_bbox(Sphere *this)

{
  double dVar1;
  BBox *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = this->r;
  dVar3 = (this->o).x;
  dVar4 = (this->o).y;
  dVar1 = (this->o).z;
  dVar5 = dVar1 - dVar2;
  dVar6 = dVar2 + dVar3;
  dVar3 = dVar3 - dVar2;
  dVar7 = dVar2 + dVar4;
  dVar4 = dVar4 - dVar2;
  dVar2 = dVar2 + dVar1;
  (in_RDI->max).x = dVar6;
  (in_RDI->max).y = dVar7;
  (in_RDI->max).z = dVar2;
  (in_RDI->min).x = dVar3;
  (in_RDI->min).y = dVar4;
  (in_RDI->min).z = dVar5;
  (in_RDI->extent).x = 0.0;
  (in_RDI->extent).y = 0.0;
  (in_RDI->extent).x = dVar6 - dVar3;
  (in_RDI->extent).y = dVar7 - dVar4;
  (in_RDI->extent).z = dVar2 - dVar5;
  return in_RDI;
}

Assistant:

BBox get_bbox() const {
    return BBox(o - Vector3D(r,r,r), o + Vector3D(r,r,r));
  }